

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Return_AST_Node::eval_internal(Return_AST_Node *this,Dispatch_State *t_ss)

{
  Dispatch_Engine *pDVar1;
  Dispatch_Engine *pDVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 *puVar5;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pDVar1 = t_ss[3].m_engine._M_data;
  pDVar2 = (Dispatch_Engine *)t_ss[3].m_stack_holder._M_data;
  puVar5 = (undefined4 *)__cxa_allocate_exception(0x10);
  if (pDVar1 == pDVar2) {
    Boxed_Value::Object_Data::get();
    *puVar5 = local_48;
    puVar5[1] = uStack_44;
    puVar5[2] = uStack_40;
    puVar5[3] = uStack_3c;
    __cxa_throw(puVar5,&detail::Return_Value::typeinfo,detail::Return_Value::~Return_Value);
  }
  AST_Node::eval((AST_Node *)&stack0xffffffffffffffc8,
                 (Dispatch_State *)
                 ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                 __align);
  uVar3 = uStack_30;
  uVar4 = uStack_2c;
  _uStack_30 = (element_type *)0x0;
  *puVar5 = local_38;
  puVar5[1] = uStack_34;
  puVar5[2] = uVar3;
  puVar5[3] = uVar4;
  _local_38 = (_func_int **)0x0;
  __cxa_throw(puVar5,&detail::Return_Value::typeinfo,detail::Return_Value::~Return_Value);
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          if (!this->children.empty()) {
            throw detail::Return_Value(children[0]->eval(t_ss));
          }
          else {
            throw detail::Return_Value(Boxed_Value());
          }
        }